

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

int secp256k1_musig_compute_pks_hash
              (secp256k1_context *ctx,uchar *pks_hash,secp256k1_pubkey **pks,size_t np)

{
  int iVar1;
  ulong in_RCX;
  size_t ser_len;
  uchar ser [33];
  size_t i;
  secp256k1_sha256 sha;
  long lVar2;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_sha256 *in_stack_ffffffffffffff40;
  ulong local_98;
  uint in_stack_ffffffffffffff9c;
  secp256k1_pubkey *in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffb0;
  secp256k1_context *in_stack_ffffffffffffffb8;
  
  secp256k1_musig_keyagglist_sha256((secp256k1_sha256 *)0x1094e1);
  local_98 = 0;
  while( true ) {
    if (in_RCX <= local_98) {
      secp256k1_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      return 1;
    }
    lVar2 = 0x21;
    iVar1 = secp256k1_ec_pubkey_serialize
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                       ,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (iVar1 == 0) break;
    if (lVar2 != 0x21) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/keyagg_impl.h"
              ,0x5a,"test condition failed: ser_len == sizeof(ser)");
      abort();
    }
    secp256k1_sha256_write(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x21);
    local_98 = local_98 + 1;
  }
  return 0;
}

Assistant:

static int secp256k1_musig_compute_pks_hash(const secp256k1_context *ctx, unsigned char *pks_hash, const secp256k1_pubkey * const* pks, size_t np) {
    secp256k1_sha256 sha;
    size_t i;

    secp256k1_musig_keyagglist_sha256(&sha);
    for (i = 0; i < np; i++) {
        unsigned char ser[33];
        size_t ser_len = sizeof(ser);
        if (!secp256k1_ec_pubkey_serialize(ctx, ser, &ser_len, pks[i], SECP256K1_EC_COMPRESSED)) {
            return 0;
        }
        VERIFY_CHECK(ser_len == sizeof(ser));
        secp256k1_sha256_write(&sha, ser, sizeof(ser));
    }
    secp256k1_sha256_finalize(&sha, pks_hash);
    return 1;
}